

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_encoder.h
# Opt level: O3

void __thiscall
draco::RAnsSymbolEncoder<8>::EndEncoding(RAnsSymbolEncoder<8> *this,EncoderBuffer *buffer)

{
  uint uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  uint8_t *puVar4;
  pointer __src;
  uint8_t uVar5;
  int iVar6;
  long lVar7;
  unsigned_long val;
  ulong __n;
  pointer pcVar8;
  EncoderBuffer var_size_buffer;
  EncoderBuffer local_60;
  
  pcVar8 = (buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = this->buffer_offset_;
  uVar2 = (this->ans_).ans_.state;
  uVar1 = uVar2 - 0x4000;
  uVar5 = (uint8_t)uVar2;
  if (uVar1 < 0x40) {
    (this->ans_).ans_.buf[(this->ans_).ans_.buf_offset] = uVar5;
    iVar6 = (this->ans_).ans_.buf_offset + 1;
  }
  else if (uVar1 < 0x4000) {
    *(short *)((this->ans_).ans_.buf + (this->ans_).ans_.buf_offset) = (short)uVar2;
    iVar6 = (this->ans_).ans_.buf_offset + 2;
  }
  else if (uVar1 < 0x400000) {
    puVar4 = (this->ans_).ans_.buf;
    lVar7 = (long)(this->ans_).ans_.buf_offset;
    puVar4[lVar7] = uVar5;
    puVar4[lVar7 + 1] = (uint8_t)(uVar2 + 0x7fc000 >> 8);
    puVar4[lVar7 + 2] = (uint8_t)(uVar2 + 0x7fc000 >> 0x10);
    iVar6 = (this->ans_).ans_.buf_offset + 3;
  }
  else if (uVar1 < 0x40000000) {
    puVar4 = (this->ans_).ans_.buf;
    lVar7 = (long)(this->ans_).ans_.buf_offset;
    iVar6 = uVar2 + 0xbfffc000;
    puVar4[lVar7] = uVar5;
    puVar4[lVar7 + 1] = (uint8_t)((uint)iVar6 >> 8);
    puVar4[lVar7 + 2] = (uint8_t)((uint)iVar6 >> 0x10);
    puVar4[lVar7 + 3] = (uint8_t)((uint)iVar6 >> 0x18);
    iVar6 = (this->ans_).ans_.buf_offset + 4;
  }
  else {
    iVar6 = (this->ans_).ans_.buf_offset;
  }
  val = (unsigned_long)iVar6;
  EncoderBuffer::EncoderBuffer(&local_60);
  EncodeVarint<unsigned_long>(val,&local_60);
  __src = local_60.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start;
  pcVar8 = pcVar8 + uVar3;
  __n = (ulong)(uint)((int)local_60.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (int)local_60.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  memmove(pcVar8 + __n,pcVar8,val);
  memcpy(pcVar8,__src,__n);
  EncoderBuffer::Resize(buffer,__n + val + this->buffer_offset_);
  if (local_60.bit_encoder_._M_t.
      super___uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
      ._M_t.
      super__Tuple_impl<0UL,_draco::EncoderBuffer::BitEncoder_*,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
      .super__Head_base<0UL,_draco::EncoderBuffer::BitEncoder_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
       )0x0) {
    operator_delete((void *)local_60.bit_encoder_._M_t.
                            super___uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_draco::EncoderBuffer::BitEncoder_*,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
                            .super__Head_base<0UL,_draco::EncoderBuffer::BitEncoder_*,_false>.
                            _M_head_impl,0x10);
  }
  local_60.bit_encoder_._M_t.
  super___uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
  ._M_t.
  super__Tuple_impl<0UL,_draco::EncoderBuffer::BitEncoder_*,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
  .super__Head_base<0UL,_draco::EncoderBuffer::BitEncoder_*,_false>._M_head_impl =
       (__uniq_ptr_data<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>,_true,_true>
        )(__uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
          )0x0;
  if (local_60.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void RAnsSymbolEncoder<unique_symbols_bit_length_t>::EndEncoding(
    EncoderBuffer *buffer) {
  char *const src = const_cast<char *>(buffer->data()) + buffer_offset_;

  // TODO(fgalligan): Look into changing this to uint32_t as write_end()
  // returns an int.
  const uint64_t bytes_written = static_cast<uint64_t>(ans_.write_end());
  EncoderBuffer var_size_buffer;
  EncodeVarint(bytes_written, &var_size_buffer);
  const uint32_t size_len = static_cast<uint32_t>(var_size_buffer.size());
  char *const dst = src + size_len;
  memmove(dst, src, bytes_written);

  // Store the size of the encoded data.
  memcpy(src, var_size_buffer.data(), size_len);

  // Resize the buffer to match the number of encoded bytes.
  buffer->Resize(buffer_offset_ + bytes_written + size_len);
}